

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O2

bool __thiscall ArgParser::ArgIterator::match(ArgIterator *this,char *name)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  range_error *this_00;
  
  if (this->i == this->argc) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"arg out of range");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  sVar2 = stringlength<char>(name);
  sVar3 = stringlength<char>(this->p);
  if ((sVar2 <= sVar3) &&
     (bVar1 = std::__equal<true>::equal<char>(name,name + sVar2,this->p), bVar1)) {
    this->p = this->p + sVar2;
    this->longmatch = true;
    return true;
  }
  return false;
}

Assistant:

bool match(const char*name)
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            auto namelen = stringlength(name);
            if (namelen > stringlength(p))
                return false;
            if (std::equal(name, name+namelen, p)) {
                p += namelen;
                longmatch = true;
                return true;
            }
            return false;
        }